

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointObservationDiscrete.cpp
# Opt level: O2

void __thiscall
JointObservationDiscrete::AddIndividualObservation
          (JointObservationDiscrete *this,ObservationDiscrete *a,Index agentI)

{
  ostream *poVar1;
  ObservationDiscrete *local_28;
  Index local_1c;
  
  local_28 = a;
  if ((long)(this->_m_opVector).
            super__Vector_base<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_m_opVector).
            super__Vector_base<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)agentI) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "WARNING! AddIndividualAction: size of _m_opVector does not match index of agent!\n _m_opVector.size()="
                            );
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," - agentI=");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>::push_back
            (&this->_m_opVector,&local_28);
  local_1c = (local_28->super_DiscreteEntity)._m_index;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->_m_oIndexVector,&local_1c);
  return;
}

Assistant:

void JointObservationDiscrete::AddIndividualObservation(const ObservationDiscrete* a,  Index agentI)
{
    if (agentI != _m_opVector.size() )
    cout << "WARNING! AddIndividualAction: size of _m_opVector does not match index of agent!\n _m_opVector.size()="<< _m_opVector.size()<<" - agentI="<<agentI<<endl;    
    _m_opVector.push_back(a);
    _m_oIndexVector.push_back(a->GetIndex());
}